

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  _Rb_tree_header *p_Var1;
  cmTarget *pcVar2;
  _Base_ptr p_Var3;
  cmGeneratorTarget *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range1;
  _Hash_node_base *p_Var6;
  pointer ppcVar7;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> itgts;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_48;
  
  if (targetTypes == AllTargets) {
    for (p_Var6 = (mf->Targets)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      this_00 = (cmGeneratorTarget *)operator_new(0x5a8);
      cmGeneratorTarget::cmGeneratorTarget(this_00,(cmTarget *)(p_Var6 + 5),lg);
      cmLocalGenerator::AddGeneratorTarget(lg,this_00);
    }
  }
  cmMakefile::GetImportedTargets(&local_48,mf);
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(importedMap->_M_t)._M_impl.super__Rb_tree_header;
    ppcVar7 = local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pcVar2 = *ppcVar7;
      p_Var3 = (importedMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(cmTarget **)(p_Var3 + 1) < pcVar2]) {
        if (*(cmTarget **)(p_Var3 + 1) >= pcVar2) {
          p_Var4 = p_Var3;
        }
      }
      p_Var5 = p_Var1;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var5 = (_Rb_tree_header *)p_Var4,
         pcVar2 < (cmTarget *)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var5 = p_Var1;
      }
      cmLocalGenerator::AddImportedGeneratorTarget(lg,*(cmGeneratorTarget **)(p_Var5 + 1));
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
  TargetTypes targetTypes, cmMakefile* mf, cmLocalGenerator* lg,
  std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets) {
    cmTargets& targets = mf->GetTargets();
    for (auto& target : targets) {
      cmTarget* t = &target.second;
      cmGeneratorTarget* gt = new cmGeneratorTarget(t, lg);
      lg->AddGeneratorTarget(gt);
    }
  }

  std::vector<cmTarget*> itgts = mf->GetImportedTargets();

  for (cmTarget* t : itgts) {
    lg->AddImportedGeneratorTarget(importedMap.find(t)->second);
  }
}